

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::MinorGCMark(GC *this)

{
  GCObject *pGVar1;
  bool bVar2;
  reference ppGVar3;
  _Self *in_RDI;
  GCObject *obj;
  iterator __end1;
  iterator __begin1;
  deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_> *__range1;
  BarrieredMarkVisitor barriered_maker;
  MinorMarkVisitor marker;
  _Self *in_stack_ffffffffffffff88;
  _Deque_iterator<luna::GCObject_*,_luna::GCObject_*&,_luna::GCObject_**> local_40;
  _Elt_pointer *local_20;
  undefined1 local_18 [24];
  
  bVar2 = std::function::operator_cast_to_bool((function<void_(luna::GCObjectVisitor_*)> *)0x13690c)
  ;
  if (!bVar2) {
    __assert_fail("minor_traveller_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/GC.cpp",
                  0x112,"void luna::GC::MinorGCMark()");
  }
  MinorMarkVisitor::MinorMarkVisitor((MinorMarkVisitor *)in_RDI);
  std::function<void_(luna::GCObjectVisitor_*)>::operator()
            ((function<void_(luna::GCObjectVisitor_*)> *)in_RDI,
             (GCObjectVisitor *)in_stack_ffffffffffffff88);
  BarrieredMarkVisitor::BarrieredMarkVisitor((BarrieredMarkVisitor *)in_RDI);
  local_20 = &in_RDI[3]._M_last;
  std::deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::begin
            ((deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_> *)in_stack_ffffffffffffff88
            );
  std::deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::end
            ((deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_> *)in_stack_ffffffffffffff88
            );
  while( true ) {
    bVar2 = std::operator!=(in_RDI,in_stack_ffffffffffffff88);
    if (!bVar2) {
      return;
    }
    ppGVar3 = std::_Deque_iterator<luna::GCObject_*,_luna::GCObject_*&,_luna::GCObject_**>::
              operator*(&local_40);
    pGVar1 = *ppGVar3;
    if ((pGVar1->field_0x10 & 3) == 0) break;
    pGVar1->field_0x10 = pGVar1->field_0x10 & 0xf3 | 4;
    (*pGVar1->_vptr_GCObject[2])(pGVar1,local_18);
    std::_Deque_iterator<luna::GCObject_*,_luna::GCObject_*&,_luna::GCObject_**>::operator++(in_RDI)
    ;
  }
  __assert_fail("obj->generation_ != GCGen0",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/GC.cpp",
                0x11d,"void luna::GC::MinorGCMark()");
}

Assistant:

void GC::MinorGCMark()
    {
        assert(minor_traveller_);

        // Visit all minor GC root objects
        MinorMarkVisitor marker;
        minor_traveller_(&marker);

        // Visit all barriered GC objects
        BarrieredMarkVisitor barriered_maker;
        for (auto obj : barriered_)
        {
            // All barriered objects must be GCGen1 or GCGen2.
            assert(obj->generation_ != GCGen0);

            // Mark barriered objects, and visitor can visit
            // member GC objects of barriered objects.
            obj->gc_ = GCFlag_Black;
            obj->Accept(&barriered_maker);
        }
    }